

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall compressed_sparse_matrix<int>::push_back(compressed_sparse_matrix<int> *this,int e)

{
  reference pvVar1;
  undefined4 in_ESI;
  value_type_conflict4 *in_RDI;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  pvVar1 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::back(unaff_retaddr);
  *pvVar1 = *pvVar1 + 1;
  return;
}

Assistant:

void push_back(ValueType e) {
		assert(0 < size());
		entries.push_back(e);
		++bounds.back();
	}